

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

void __thiscall
boost::exception_detail::clone_impl<boost::exception_detail::bad_alloc_>::clone_impl
          (clone_impl<boost::exception_detail::bad_alloc_> *this,exception *x)

{
  error_info_container *peVar1;
  char *pcVar2;
  
  *(undefined ***)&this->field_0x30 = &PTR___cxa_pure_virtual_001cb0c8;
  (this->super_bad_alloc_).super_exception._vptr_exception =
       (_func_int **)&PTR___cxa_pure_virtual_001cb168;
  peVar1 = (x->data_).px_;
  (this->super_bad_alloc_).super_exception.data_.px_ = peVar1;
  if (peVar1 != (error_info_container *)0x0) {
    (**(code **)(*(long *)peVar1 + 0x18))();
  }
  (this->super_bad_alloc_).super_exception.throw_line_ = x->throw_line_;
  pcVar2 = x->throw_file_;
  (this->super_bad_alloc_).super_exception.throw_function_ = x->throw_function_;
  (this->super_bad_alloc_).super_exception.throw_file_ = pcVar2;
  (this->super_bad_alloc_).super_exception._vptr_exception = (_func_int **)0x1cb4b0;
  *(undefined8 *)&(this->super_bad_alloc_).super_bad_alloc = 0x1cb4e0;
  *(undefined8 *)&this->field_0x30 = 0x1cb520;
  copy_boost_exception((exception *)this,x);
  return;
}

Assistant:

clone_impl( clone_impl const & x, clone_tag ):
                T(x)
                {
                copy_boost_exception(this,&x);
                }